

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (StringFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  TVar1 = FieldDescriptor::type((this->super_FieldGenerator).descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              ((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_,false,
               "this->_internal_$name$().data(), static_cast<int>(this->_internal_$name$().length()),\n"
               ,(Formatter *)local_50);
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "target = stream->Write$declared_type$MaybeAliased(\n    $number$, this->_internal_$name$(), target);\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, false,
        "this->_internal_$name$().data(), "
        "static_cast<int>(this->_internal_$name$().length()),\n",
        format);
  }
  format(
      "target = stream->Write$declared_type$MaybeAliased(\n"
      "    $number$, this->_internal_$name$(), target);\n");
}